

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_type.cpp
# Opt level: O3

ostream * operator<<(ostream *stream,node_type id)

{
  int iVar1;
  
  if (operator<<(std::ostream&,node_type)::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,node_type)::name_abi_cxx11_);
    if (iVar1 != 0) {
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[0]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&operator<<(std::ostream&,node_type)::name_abi_cxx11_,"D","");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[1]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 1),"P0",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[2]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 2),"I1",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[3]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 3),"P1",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[4]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 4),"I2",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[5]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[5].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 5),"P2",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[6]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[6].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 6),"I3",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[7]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[7].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 7),"P3",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[8]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[8].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 8),"I4",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[9]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[9].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 9),"P4",
                 "");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[10]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[10].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 10),"P5"
                 ,"");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[0xb]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[0xb].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 0xb),
                 "P6","");
      operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[0xc]._M_dataplus._M_p =
           (pointer)&operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems[0xc].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 0xc),
                 "P7","");
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                   ::~array,&operator<<(std::ostream&,node_type)::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,node_type)::name_abi_cxx11_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(char *)(&boost::test_tools::fpc_tolerance<double>()::s_value)[(ulong)id * 4],
             *(long *)(&std::__ioinit + (ulong)id * 0x20));
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, node_type id)
{
    static const std::array<std::string, 13> name = { "D", "P0", "I1", "P1", "I2", "P2", "I3", "P3", "I4", "P4", "P5", "P6", "P7"};
    stream << name[id - 1];
    return stream;
}